

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitAtomicWait(FunctionValidator *this,AtomicWait *curr)

{
  bool result;
  Module *pMVar1;
  Type local_88;
  Type local_80;
  uintptr_t local_78;
  uintptr_t local_70;
  uintptr_t local_68;
  address64_t local_60;
  address64_t local_58;
  uintptr_t local_50;
  Type local_48;
  Type local_40;
  Type local_38;
  address64_t local_30;
  address64_t local_28;
  Memory *local_20;
  Memory *memory;
  AtomicWait *curr_local;
  FunctionValidator *this_local;
  
  memory = (Memory *)curr;
  curr_local = (AtomicWait *)this;
  pMVar1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  local_30 = (memory->initial).addr;
  local_28 = (memory->max).addr;
  local_20 = Module::getMemoryOrNull(pMVar1,(IString)*(IString *)&memory->initial);
  shouldBeTrue<wasm::AtomicWait*>
            (this,local_20 != (Memory *)0x0,(AtomicWait *)memory,
             "memory.atomicWait memory must exist");
  pMVar1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  result = FeatureSet::hasAtomics(&pMVar1->features);
  shouldBeTrue<wasm::AtomicWait*>
            (this,result,(AtomicWait *)memory,"Atomic operations require threads [--enable-threads]"
            );
  local_38.id = (uintptr_t)(memory->super_Importable).super_Named.name.super_IString.str._M_str;
  wasm::Type::Type(&local_40,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicWait*,wasm::Type>
            (this,local_38,local_40,(AtomicWait *)memory,"AtomicWait must have type i32");
  local_48.id = *(uintptr_t *)((memory->super_Importable).module.super_IString.str._M_len + 8);
  local_60 = (memory->initial).addr;
  local_58 = (memory->max).addr;
  local_50 = (uintptr_t)indexType(this,(IString)*(IString *)&memory->initial);
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicWait*,wasm::Type>
            (this,local_48,(Type)local_50,(AtomicWait *)memory,
             "AtomicWait pointer must match memory index type");
  local_68 = *(uintptr_t *)((memory->super_Importable).module.super_IString.str._M_str + 8);
  shouldBeIntOrUnreachable
            (this,(Type)local_68,(Expression *)memory,"AtomicWait expected type must be int");
  local_70 = *(uintptr_t *)((memory->super_Importable).module.super_IString.str._M_str + 8);
  local_78 = (uintptr_t)(memory->super_Importable).base.super_IString.str._M_str;
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicWait*,wasm::Type>
            (this,(Type)local_70,(Type)local_78,(AtomicWait *)memory,
             "AtomicWait expected type must match operand");
  local_80.id = *(uintptr_t *)((memory->super_Importable).base.super_IString.str._M_len + 8);
  wasm::Type::Type(&local_88,i64);
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicWait*,wasm::Type>
            (this,local_80,local_88,(AtomicWait *)memory,"AtomicWait timeout type must be i64");
  return;
}

Assistant:

void FunctionValidator::visitAtomicWait(AtomicWait* curr) {
  auto* memory = getModule()->getMemoryOrNull(curr->memory);
  shouldBeTrue(!!memory, curr, "memory.atomicWait memory must exist");
  shouldBeTrue(getModule()->features.hasAtomics(),
               curr,
               "Atomic operations require threads [--enable-threads]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->type, Type(Type::i32), curr, "AtomicWait must have type i32");
  shouldBeEqualOrFirstIsUnreachable(
    curr->ptr->type,
    indexType(curr->memory),
    curr,
    "AtomicWait pointer must match memory index type");
  shouldBeIntOrUnreachable(
    curr->expected->type, curr, "AtomicWait expected type must be int");
  shouldBeEqualOrFirstIsUnreachable(
    curr->expected->type,
    curr->expectedType,
    curr,
    "AtomicWait expected type must match operand");
  shouldBeEqualOrFirstIsUnreachable(curr->timeout->type,
                                    Type(Type::i64),
                                    curr,
                                    "AtomicWait timeout type must be i64");
}